

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cpp
# Opt level: O0

void __thiscall primesieve::iterator::generate_next_primes(iterator *this)

{
  bool bVar1;
  PrimeGenerator *this_00;
  uint64_t *in_RDI;
  size_t *in_stack_00000010;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000018;
  PrimeGenerator *in_stack_00000020;
  PrimeGenerator *p;
  pointer in_stack_ffffffffffffffc8;
  uint64_t in_stack_ffffffffffffffe0;
  uint64_t *in_stack_ffffffffffffffe8;
  PrimeGenerator *in_stack_fffffffffffffff0;
  
  while( true ) {
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<primesieve::PrimeGenerator,_std::default_delete<primesieve::PrimeGenerator>_>
                        *)0x151671);
    if (!bVar1) {
      IteratorHelper::next
                ((uint64_t *)in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,
                 in_stack_ffffffffffffffe0,in_RDI);
      this_00 = (PrimeGenerator *)operator_new(0xb30);
      PrimeGenerator::PrimeGenerator
                (in_stack_fffffffffffffff0,(uint64_t)in_stack_ffffffffffffffe8,
                 in_stack_ffffffffffffffe0);
      std::unique_ptr<primesieve::PrimeGenerator,_std::default_delete<primesieve::PrimeGenerator>_>
      ::reset((unique_ptr<primesieve::PrimeGenerator,_std::default_delete<primesieve::PrimeGenerator>_>
               *)this_00,in_stack_ffffffffffffffc8);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,
                 (size_type)in_stack_ffffffffffffffe8);
      in_stack_fffffffffffffff0 = this_00;
    }
    std::unique_ptr<primesieve::PrimeGenerator,_std::default_delete<primesieve::PrimeGenerator>_>::
    operator->((unique_ptr<primesieve::PrimeGenerator,_std::default_delete<primesieve::PrimeGenerator>_>
                *)0x151721);
    PrimeGenerator::fill(in_stack_00000020,in_stack_00000018,in_stack_00000010);
    if (in_RDI[1] != 0) break;
    anon_unknown.dwarf_f1942::clear<primesieve::PrimeGenerator>
              ((unique_ptr<primesieve::PrimeGenerator,_std::default_delete<primesieve::PrimeGenerator>_>
                *)0x151753);
  }
  *in_RDI = 0;
  in_RDI[1] = in_RDI[1] - 1;
  return;
}

Assistant:

void iterator::generate_next_primes()
{
  while (true)
  {
    if (!primeGenerator_)
    {
      IteratorHelper::next(&start_, &stop_, stop_hint_, &dist_);
      auto p = new PrimeGenerator(start_, stop_);
      primeGenerator_.reset(p);
      primes_.resize(256);
    }

    primeGenerator_->fill(primes_, &last_idx_);

    // There are 3 different cases here:
    // 1) The primes array contains a few primes (<= 256).
    //    In this case we return the primes to the user.
    // 2) The primes array is empty because the next
    //    prime > stop. In this case we reset the
    //    primeGenerator object, increase the start & stop
    //    numbers and sieve the next segment.
    // 3) The next prime > 2^64. In this case the primes
    //    array contains an error code (UINT64_MAX) which
    //    is returned to the user.
    if (last_idx_ == 0)
      clear(primeGenerator_);
    else
      break;
  }

  i_ = 0;
  last_idx_--;
}